

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::DirectoryTreeStructureSignatureTask::start
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti)

{
  StringRef name;
  StringRef str;
  TaskInterface local_60;
  BuildKey local_50;
  long *local_30 [2];
  long local_20 [2];
  
  local_60.ctx = ti.ctx;
  local_60.impl = ti.impl;
  if ((this->filters).size == 0) {
    str.Data = (this->path)._M_dataplus._M_p;
    str.Length = (this->path)._M_string_length;
    llbuild::buildsystem::BuildKey::BuildKey(&local_50,'D',str);
  }
  else {
    name.Data = (this->path)._M_dataplus._M_p;
    name.Length = (this->path)._M_string_length;
    llbuild::buildsystem::BuildKey::BuildKey<llbuild::basic::StringList>
              (&local_50,'d',name,&this->filters);
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,local_50.key.key._M_dataplus._M_p,
             local_50.key.key._M_dataplus._M_p + local_50.key.key._M_string_length);
  llbuild::core::TaskInterface::request(&local_60,(KeyType *)local_30,0);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
    operator_delete(local_50.key.key._M_dataplus._M_p,
                    local_50.key.key.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Ask for the base directory directory contents.
    if (filters.isEmpty()) {
      ti.request(BuildKey::makeDirectoryContents(path).toData(), /*inputID=*/0);
    } else {
      ti.request(BuildKey::makeFilteredDirectoryContents(path, filters).toData(),
                 /*inputID=*/0);
    }
  }